

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O3

int realloc_substr_buffer(size_t need_len,char **buffer,size_t *buffer_len)

{
  int iVar1;
  char *pcVar2;
  ulong size;
  
  size = (need_len & 0xffffffffffffffc0) + 0x80;
  if (*buffer != (char *)0x0) {
    if (size <= *buffer_len) {
      return 0;
    }
    wally_free(*buffer);
  }
  pcVar2 = (char *)wally_malloc(size);
  *buffer = pcVar2;
  if (pcVar2 == (char *)0x0) {
    iVar1 = -3;
  }
  else {
    *buffer_len = size;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int realloc_substr_buffer(size_t need_len, char **buffer, size_t *buffer_len)
{
    size_t need_size = ((need_len / 64) + 2) * 64;
    if ((*buffer == NULL) || (need_size > *buffer_len)) {
        if (*buffer != NULL)
            wally_free(*buffer);

        *buffer = (char *) wally_malloc(need_size);
        if (*buffer == NULL)
            return WALLY_ENOMEM;

        *buffer_len = need_size;
    }
    return WALLY_OK;
}